

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdAddPsbtGlobalXpubkey
              (void *handle,void *psbt_handle,char *xpubkey,char *fingerprint,char *bip32_path)

{
  bool bVar1;
  byte bVar2;
  NetType NVar3;
  undefined8 uVar4;
  long lVar5;
  size_t sVar6;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  char *in_R8;
  CfdException *except;
  exception *std_except;
  bool has_mainnet;
  KeyData key_data;
  string xpub_str;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  KeyData *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff550;
  allocator *paVar7;
  undefined8 in_stack_fffffffffffff558;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff648;
  void *in_stack_fffffffffffff650;
  string local_9a8;
  ByteData local_988;
  allocator local_969;
  string local_968;
  ExtPubkey local_948;
  KeyData local_8d8;
  undefined1 local_782;
  allocator local_781;
  string local_780 [32];
  CfdSourceLocation local_760;
  undefined1 local_742;
  allocator local_741;
  string local_740 [32];
  CfdSourceLocation local_720;
  byte local_701;
  ByteData local_700;
  string local_6e8;
  undefined1 local_6c2;
  allocator local_6c1;
  string local_6c0 [32];
  CfdSourceLocation local_6a0;
  ExtPubkey local_688;
  undefined1 local_613;
  undefined1 local_612;
  allocator local_611;
  string local_610 [32];
  CfdSourceLocation local_5f0;
  KeyData local_5d8;
  ByteData local_488;
  allocator local_469;
  string local_468;
  ByteData local_448;
  ExtPubkey local_430;
  KeyData local_3c0;
  KeyData local_270;
  allocator local_119;
  string local_118;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff558 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PsbtHandle",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x83c;
    local_90.funcname = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>(&local_90,"xpubkey is null or empty.");
    local_b2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,"Failed to parameter. xpubkey is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
    local_b2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_78 + 0x18) == 0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x842;
    local_d0.funcname = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::warn<>(&local_d0,"psbt is null.");
    local_f2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to handle statement. psbt is null.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
    local_f2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,local_20,&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::KeyData::KeyData(&local_270);
  lVar5 = std::__cxx11::string::length();
  if (lVar5 == 0x9c) {
    cfd::core::ByteData::ByteData(&local_448,&local_118);
    cfd::core::ExtPubkey::ExtPubkey(&local_430,&local_448);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"",&local_469);
    cfd::core::ByteData::ByteData(&local_488);
    cfd::core::KeyData::KeyData(&local_3c0,&local_430,&local_468,&local_488);
    cfd::core::KeyData::operator=(&local_270,&local_3c0);
    cfd::core::KeyData::~KeyData(in_stack_fffffffffffff540);
    cfd::core::ByteData::~ByteData((ByteData *)0x5fd52d);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff540);
    cfd::core::ByteData::~ByteData((ByteData *)0x5fd561);
  }
  else {
    cfd::core::KeyData::KeyData(&local_5d8,&local_118,-1,false);
    cfd::core::KeyData::operator=(&local_270,&local_5d8);
    cfd::core::KeyData::~KeyData(in_stack_fffffffffffff540);
    bVar1 = cfd::core::KeyData::HasExtPubkey(&local_270);
    if ((!bVar1) || (bVar1 = cfd::core::KeyData::HasExtPrivkey(&local_270), bVar1)) {
      local_5f0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_5f0.filename = local_5f0.filename + 1;
      local_5f0.line = 0x84f;
      local_5f0.funcname = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::warn<>(&local_5f0,"psbt invalid xpubkey format.");
      local_612 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_610,"Failed to parameter. psbt invalid xpubkey format.",&local_611);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
      local_612 = 0;
      __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
  }
  cfd::core::KeyData::GetExtPubkey(&local_688,&local_270);
  NVar3 = cfd::core::ExtPubkey::GetNetworkType(&local_688);
  bVar1 = NVar3 == kMainnet;
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff540);
  local_613 = bVar1;
  if (((*(int *)(local_78 + 0x10) != 0) || (bVar1)) &&
     ((*(int *)(local_78 + 0x10) == 0 || (!bVar1)))) {
    local_701 = 0;
    cfd::core::KeyData::GetBip32Path_abi_cxx11_(&local_6e8,&local_270,kApostrophe,false);
    bVar2 = std::__cxx11::string::empty();
    bVar1 = true;
    if ((bVar2 & 1) == 0) {
      cfd::core::KeyData::GetFingerprint(&local_700,&local_270);
      local_701 = 1;
      sVar6 = cfd::core::ByteData::GetDataSize(&local_700);
      bVar1 = sVar6 != 4;
    }
    if ((local_701 & 1) != 0) {
      cfd::core::ByteData::~ByteData((ByteData *)0x5fdabe);
    }
    std::__cxx11::string::~string((string *)&local_6e8);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(local_28);
      if (bVar1) {
        local_720.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        local_720.filename = local_720.filename + 1;
        local_720.line = 0x863;
        local_720.funcname = "CfdAddPsbtGlobalXpubkey";
        cfd::core::logger::warn<>(&local_720,"fingerprint is null or empty.");
        local_742 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_740,"Failed to parameter. fingerprint is null or empty.",&local_741);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
        local_742 = 0;
        __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      bVar1 = cfd::capi::IsEmptyString(local_30);
      if (bVar1) {
        local_760.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        local_760.filename = local_760.filename + 1;
        local_760.line = 0x869;
        local_760.funcname = "CfdAddPsbtGlobalXpubkey";
        cfd::core::logger::warn<>(&local_760,"bip32_path is null or empty.");
        local_782 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_780,"Failed to parameter. bip32_path is null or empty.",&local_781);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
        local_782 = 0;
        __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      cfd::core::KeyData::GetExtPubkey(&local_948,&local_270);
      paVar7 = &local_969;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_968,local_30,paVar7);
      paVar7 = (allocator *)&stack0xfffffffffffff657;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9a8,local_28,paVar7);
      cfd::core::ByteData::ByteData(&local_988,&local_9a8);
      cfd::core::KeyData::KeyData(&local_8d8,&local_948,&local_968,&local_988);
      cfd::core::KeyData::operator=(&local_270,&local_8d8);
      cfd::core::KeyData::~KeyData(in_stack_fffffffffffff540);
      cfd::core::ByteData::~ByteData((ByteData *)0x5fdebd);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff657);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff540);
    }
    cfd::core::Psbt::SetGlobalXpubkey(*(Psbt **)(local_78 + 0x18),&local_270);
    local_4 = 0;
    cfd::core::KeyData::~KeyData(in_stack_fffffffffffff540);
    std::__cxx11::string::~string((string *)&local_118);
    return local_4;
  }
  local_6a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  local_6a0.filename = local_6a0.filename + 1;
  local_6a0.line = 0x85a;
  local_6a0.funcname = "CfdAddPsbtGlobalXpubkey";
  cfd::core::logger::warn<>(&local_6a0,"unmatch xpubkey network type.");
  local_6c2 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6c0,"Failed to parameter. unmatch xpubkey network type.",&local_6c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff560,error_code,in_stack_fffffffffffff550);
  local_6c2 = 0;
  __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPsbtGlobalXpubkey(
    void* handle, void* psbt_handle, const char* xpubkey,
    const char* fingerprint, const char* bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(xpubkey)) {
      warn(CFD_LOG_SOURCE, "xpubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. xpubkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string xpub_str(xpubkey);
    KeyData key_data;
    if (xpub_str.length() == kCfdExtPubkeyHexSize) {
      key_data = KeyData(ExtPubkey(ByteData(xpub_str)), "", ByteData());
    } else {
      key_data = KeyData(xpub_str);
      if ((!key_data.HasExtPubkey()) || key_data.HasExtPrivkey()) {
        warn(CFD_LOG_SOURCE, "psbt invalid xpubkey format.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. psbt invalid xpubkey format.");
      }
    }

    bool has_mainnet =
        (key_data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);
    if (((psbt_obj->net_type == NetType::kMainnet) && (!has_mainnet)) ||
        ((psbt_obj->net_type != NetType::kMainnet) && (has_mainnet))) {
      warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. unmatch xpubkey network type.");
    }

    if (key_data.GetBip32Path().empty() ||
        (key_data.GetFingerprint().GetDataSize() != 4)) {
      if (IsEmptyString(fingerprint)) {
        warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. fingerprint is null or empty.");
      }
      if (IsEmptyString(bip32_path)) {
        warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. bip32_path is null or empty.");
      }
      key_data = KeyData(
          key_data.GetExtPubkey(), std::string(bip32_path),
          ByteData(fingerprint));
    }
    psbt_obj->psbt->SetGlobalXpubkey(key_data);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}